

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::~DrawTestInstanceBase(DrawTestInstanceBase *this)

{
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR___cxa_pure_virtual_00bd80b0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&this->m_vertexBuffer);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  de::SharedPtr<vkt::Draw::Image>::release(&this->m_colorTargetImage);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  std::_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ::~_Vector_base((_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                   *)&this->m_data);
  return;
}

Assistant:

DrawTestInstanceBase::~DrawTestInstanceBase (void)
{
}